

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O2

void testing::internal::ContainerPrinter::
     PrintValue<std::__cxx11::list<float,std::allocator<float>>,void>
               (list<float,_std::allocator<float>_> *container,ostream *os)

{
  long lVar1;
  _List_node_base *p_Var2;
  
  std::operator<<(os,'{');
  lVar1 = 0;
  p_Var2 = (_List_node_base *)container;
  do {
    p_Var2 = (((_List_base<float,_std::allocator<float>_> *)&p_Var2->_M_next)->_M_impl)._M_node.
             super__List_node_base._M_next;
    if (p_Var2 == (_List_node_base *)container) {
      if (lVar1 != 0) {
LAB_001ce71d:
        std::operator<<(os,' ');
      }
      std::operator<<(os,'}');
      return;
    }
    if ((lVar1 != 0) && (std::operator<<(os,','), lVar1 == 0x20)) {
      std::operator<<(os," ...");
      goto LAB_001ce71d;
    }
    std::operator<<(os,' ');
    internal_stream_operator_without_lexical_name_lookup::StreamPrinter::
    PrintValue<float,void,std::ostream&>((float *)(p_Var2 + 1),os);
    lVar1 = lVar1 + 1;
  } while( true );
}

Assistant:

static void PrintValue(const T& container, std::ostream* os) {
    const size_t kMaxCount = 32;  // The maximum number of elements to print.
    *os << '{';
    size_t count = 0;
    for (auto&& elem : container) {
      if (count > 0) {
        *os << ',';
        if (count == kMaxCount) {  // Enough has been printed.
          *os << " ...";
          break;
        }
      }
      *os << ' ';
      // We cannot call PrintTo(elem, os) here as PrintTo() doesn't
      // handle `elem` being a native array.
      internal::UniversalPrint(elem, os);
      ++count;
    }

    if (count > 0) {
      *os << ' ';
    }
    *os << '}';
  }